

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state;
  string_t *target;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  string_t *rdata_1;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **sdata_1;
  AggregateFinalizeData finalize_data;
  string_t *rdata;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **sdata;
  ulong local_80;
  AggregateFinalizeData local_78;
  string_t *local_60;
  undefined8 in_stack_ffffffffffffffa8;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffffb0;
  AggregateFinalizeData *in_stack_ffffffffffffffc0;
  string_t *in_stack_ffffffffffffffc8;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *in_stack_ffffffffffffffd0;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    state = (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)
            ConstantVector::
            GetData<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>*>
                      ((Vector *)0x1d41960);
    target = ConstantVector::GetData<duckdb::string_t>((Vector *)0x1d4196f);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,in_RSI);
    QuantileScalarOperation<true,duckdb::QuantileStandardType>::
    Finalize<duckdb::string_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
              (state,target,in_stack_ffffffffffffffc0);
  }
  else {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    FlatVector::GetData<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>*>
              ((Vector *)0x1d419bd);
    local_60 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1d419cc);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (local_80 = 0; local_80 < in_RCX; local_80 = local_80 + 1) {
      local_78.result_idx = local_80 + in_R8;
      QuantileScalarOperation<true,duckdb::QuantileStandardType>::
      Finalize<duckdb::string_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}